

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_generic_field_getters
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  ostream *poVar2;
  t_dart_generator *this_00;
  pointer pptVar3;
  string field_name;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar2,"getFieldValue(int fieldID)");
  std::__cxx11::string::string((string *)&local_f0," ",(allocator *)&local_130);
  scope_up(this,out,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar2,"switch (fieldID)");
  std::__cxx11::string::string((string *)&local_110," ",(allocator *)&local_130);
  scope_up(this,out,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  for (pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar3 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    this_00 = (t_dart_generator *)&(*pptVar3)->name_;
    std::__cxx11::string::string((string *)&local_50,(string *)this_00);
    get_member_name(&local_130,this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"case ");
    std::__cxx11::string::string((string *)&local_90,(string *)&local_130);
    t_oop_generator::upcase_string(&local_70,&this->super_t_oop_generator,&local_90);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"return this.");
    poVar2 = std::operator<<(poVar2,(string *)&local_130);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    std::__cxx11::string::~string((string *)&local_130);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"default:");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"throw new ArgumentError(\"Field $fieldID doesn\'t exist!\");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::string::string((string *)&local_b0,(string *)&::endl_abi_cxx11_);
  scope_down(this,out,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,(string *)&endl2_abi_cxx11_);
  scope_down(this,out,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void t_dart_generator::generate_generic_field_getters(std::ostream& out,
                                                      t_struct* tstruct) {
  // create the getter
  indent(out) << "getFieldValue(int fieldID)";
  scope_up(out);

  indent(out) << "switch (fieldID)";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    std::string field_name = get_member_name(field->get_name());

    indent(out) << "case " << upcase_string(field_name) << ":" << endl;
    indent_up();
    indent(out) << "return this." << field_name << ";" << endl;
    indent_down();
  }

  indent(out) << "default:" << endl;
  indent_up();
  indent(out) << "throw new ArgumentError(\"Field $fieldID doesn't exist!\");" << endl;
  indent_down();

  scope_down(out);  // switch
  scope_down(out, endl2);  // method
}